

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_0::AsyncStreamFd::write(AsyncStreamFd *this,int __fd,void *__buf,size_t __n)

{
  Disposer *pDVar1;
  int osErrorNumber;
  void *pvVar2;
  Disposer *pDVar3;
  undefined4 in_register_00000034;
  ArrayPtr<const_unsigned_char> AVar4;
  AsyncStreamFd *local_98;
  uchar *local_90;
  undefined1 local_70 [32];
  Fault f;
  SyscallResult local_34;
  undefined1 auStack_30 [4];
  SyscallResult _kjSyscallResult;
  ssize_t n;
  AsyncStreamFd *this_local;
  ArrayPtr<const_unsigned_char> buffer_local;
  
  f.exception = (Exception *)auStack_30;
  this_local = (AsyncStreamFd *)__buf;
  buffer_local.ptr = (uchar *)__n;
  buffer_local.size_ = (size_t)this;
  local_34 = kj::_::Debug::
             syscall<kj::(anonymous_namespace)::AsyncStreamFd::write(kj::ArrayPtr<unsigned_char_const>)::_lambda()_1_>
                       ((anon_class_24_3_ed410f19 *)&f,true);
  pvVar2 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_34);
  pDVar1 = _auStack_30;
  if (pvVar2 == (void *)0x0) {
    osErrorNumber = kj::_::Debug::SyscallResult::getErrorNumber(&local_34);
    kj::_::Debug::Fault::Fault
              ((Fault *)(local_70 + 0x18),
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0xba,osErrorNumber,"n = ::write(fd, buffer.begin(), buffer.size())","");
    local_70._8_4_ = 5;
    kj::_::Debug::Fault::~Fault((Fault *)(local_70 + 0x18));
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  }
  else if ((long)_auStack_30 < 0) {
    UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)local_70);
    Promise<void>::
    then<kj::(anonymous_namespace)::AsyncStreamFd::write(kj::ArrayPtr<unsigned_char_const>)::_lambda()_2_>
              ((Promise<void> *)this,(Type *)local_70);
    Promise<void>::~Promise((Promise<void> *)local_70);
  }
  else {
    pDVar3 = (Disposer *)
             ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
    if (pDVar1 == pDVar3) {
      kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
    }
    else {
      AVar4 = ArrayPtr<const_unsigned_char>::slice
                        ((ArrayPtr<const_unsigned_char> *)&this_local,(size_t)_auStack_30);
      local_98 = (AsyncStreamFd *)AVar4.ptr;
      this_local = local_98;
      local_90 = (uchar *)AVar4.size_;
      buffer_local.ptr = local_90;
      (**(code **)(*(long *)CONCAT44(in_register_00000034,__fd) + 0xa0))
                (this,(long *)CONCAT44(in_register_00000034,__fd),local_98,local_90);
    }
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const byte> buffer) override {
    ssize_t n;
    KJ_NONBLOCKING_SYSCALL(n = ::write(fd, buffer.begin(), buffer.size())) {
      // Error.

      // We can't "return kj::READY_NOW;" inside this block because it causes a memory leak due to
      // a bug that exists in both Clang and GCC:
      //   http://gcc.gnu.org/bugzilla/show_bug.cgi?id=33799
      //   http://llvm.org/bugs/show_bug.cgi?id=12286
      goto error;
    }
    if (false) {
    error:
      return kj::READY_NOW;
    }

    if (n < 0) {
      // EAGAIN -- need to wait for writability and try again.
      return observer.whenBecomesWritable().then([buffer, this]() {
        return write(buffer);
      });
    } else if (n == buffer.size()) {
      // All done.
      return READY_NOW;
    } else {
      // Fewer than `size` bytes were written, but we CANNOT assume we're out of buffer space, as
      // Linux is known to return partial reads/writes when interrupted by a signal -- yes, even
      // for non-blocking operations. So, we'll need to write() again now, even though it will
      // almost certainly fail with EAGAIN. See comments in the read path for more info.
      buffer = buffer.slice(n);
      return write(buffer);
    }
  }